

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_add_read_buf_callback
                  (mz_zip_archive *pZip,char *pArchive_name,mz_file_read_func read_callback,
                  void *callback_opaque,mz_uint64 max_size,time_t *pFile_time,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  uint uVar2;
  bool bVar3;
  size_t sVar4;
  undefined1 uVar5;
  uint uVar6;
  mz_uint mVar7;
  mz_bool mVar8;
  mz_uint32 mVar9;
  tdefl_status tVar10;
  mz_uint64 *pmVar11;
  size_t sVar12;
  mz_uint8 *pmVar13;
  tdefl_compressor *d;
  size_t sVar14;
  tdefl_flush flush;
  mz_uint64 *pmVar15;
  mz_uint64 *pComp_size;
  mz_uint64 *pmVar16;
  mz_uint64 mVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  mz_uint64 mVar23;
  mz_uint16 extra_size;
  ulong uVar24;
  mz_uint64 mVar25;
  mz_ulong comp_size_00;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint8 *local_118;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  size_t local_100;
  mz_uint64 local_f8;
  mz_uint64 local_f0;
  mz_uint8 *local_e8;
  mz_file_read_func local_e0;
  void *local_d8;
  mz_uint64 local_dir_header_ofs;
  mz_zip_error local_c4;
  uint local_c0;
  uint local_bc;
  ulong local_b8;
  char *local_b0;
  mz_zip_writer_add_state state;
  undefined8 local_88;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined2 uStack_7a;
  undefined6 uStack_78;
  long lStack_72;
  size_t local_68;
  mz_alloc_func local_60;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  local_f8 = pZip->m_archive_size;
  uncomp_size = 0;
  comp_size = 0;
  uVar6 = 6;
  if (-1 < (int)level_and_flags) {
    uVar6 = level_and_flags;
  }
  uVar21 = uVar6 & 0x20000;
  uVar19 = uVar21 >> 0xe ^ 8;
  uVar2 = uVar19 + 0x800;
  if ((uVar6 >> 0x10 & 1) != 0) {
    uVar2 = uVar19;
  }
  uVar22 = (ulong)uVar2;
  pmVar1 = pZip->m_pState;
  if ((((pmVar1 == (mz_zip_internal_state *)0x0) || (pArchive_name == (char *)0x0)) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (pComment == (void *)0x0 && comment_size != 0 || 10 < (uVar6 & 0xf))) {
LAB_0010e270:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  iVar18 = pmVar1->m_zip64;
  if (max_size >> 0x20 != 0 && iVar18 == 0) {
    pmVar1->m_zip64 = 1;
    iVar18 = 1;
  }
  if ((uVar6 >> 10 & 1) != 0) goto LAB_0010e270;
  if (*pArchive_name == '/') {
LAB_0010e2cb:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  uVar6 = uVar6 & 0xf;
  if (iVar18 == 0) {
    bVar3 = true;
    if (pZip->m_total_files == 0xffff) {
      pmVar1->m_zip64 = 1;
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
    if (pZip->m_total_files == 0xffffffff) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  local_f0 = max_size;
  local_e0 = read_callback;
  local_d8 = callback_opaque;
  local_b0 = pArchive_name;
  local_100 = strlen(pArchive_name);
  if (0xffff < local_100) goto LAB_0010e2cb;
  mVar7 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  sVar14 = (pmVar1->m_central_dir).m_size;
  local_60 = (mz_alloc_func)(ulong)comment_size;
  if ((mz_alloc_func)0xfffffffe < local_60 + sVar14 + local_100 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  local_b8 = (ulong)mVar7;
  local_118 = (mz_uint8 *)(ulong)user_extra_data_len;
  if ((bVar3) &&
     ((ulong)(local_60 +
             sVar14 + local_b8 +
                      local_100 * 2 + (long)local_118 + user_extra_data_central_len + local_f8 +
             0x472) >> 0x20 != 0)) {
    pmVar1->m_zip64 = 1;
  }
  if (pFile_time != (time_t *)0x0) {
    mz_zip_time_t_to_dos_time(*pFile_time,&dos_time,&dos_date);
  }
  mVar23 = local_f8;
  if (local_f0 < 4) {
    uVar6 = 0;
  }
  mVar8 = mz_zip_writer_write_zeros(pZip,local_f8,mVar7);
  sVar4 = local_100;
  if (mVar8 == 0) goto LAB_0010e821;
  uVar24 = mVar23 + local_b8;
  local_dir_header_ofs = uVar24;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar24) != 0)) {
    __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                  0x2290,
                  "mz_bool mz_zip_writer_add_read_buf_callback(mz_zip_archive *, const char *, mz_file_read_func, void *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, mz_uint32, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  iVar18 = (uint)(uVar6 != 0) << 3;
  uStack_78 = 0;
  lStack_72 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uStack_7f = 0;
  uStack_7e = 0;
  uStack_7d = 0;
  uStack_7c = 0;
  uStack_7b = 0;
  uStack_7a = 0;
  local_f8 = uVar22;
  if (pmVar1->m_zip64 == 0) {
    if (uVar24 >> 0x20 != 0 || comp_size._4_4_ != 0) goto LAB_0010e480;
    uVar5 = 0x14;
    if (uVar6 == 0) {
      uVar5 = 0;
    }
    local_88._0_5_ = CONCAT14(uVar5,0x4034b50);
    local_88._0_6_ = (uint6)(uint5)local_88;
    local_88._0_7_ = CONCAT16((char)uVar2,(uint6)local_88);
    local_88 = CONCAT17((char)(uVar2 >> 8),(undefined7)local_88);
    local_b8 = CONCAT44(local_b8._4_4_,iVar18);
    uStack_7e = (undefined1)dos_time;
    local_bc = (uint)dos_time;
    uStack_7d = (undefined1)(dos_time >> 8);
    local_c0 = (uint)dos_date;
    uStack_7c = (undefined1)dos_date;
    uStack_7b = (undefined1)(dos_date >> 8);
    uStack_7a = 0;
    uStack_78 = 0;
    lStack_72 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,(short)local_100)) << 0x20;
    uStack_80 = (char)iVar18;
    sVar14 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar24,&local_88,0x1e);
    if (sVar14 != 0x1e) goto LAB_0010ec65;
    sVar14 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar24 + 0x1e,local_b0,sVar4);
    if (sVar14 != sVar4) goto LAB_0010ec65;
    mVar23 = uVar24 + 0x1e + sVar4;
    local_e8 = (mz_uint8 *)0x0;
    sVar14 = 0;
  }
  else {
    if (uVar24 < 0xffffffff && local_f0 < 0xffffffff) {
      local_e8 = (mz_uint8 *)0x0;
      sVar14 = 0;
    }
    else {
      pmVar11 = (mz_uint64 *)0x0;
      pmVar15 = &local_dir_header_ofs;
      if (uVar21 == 0) {
        if (uVar24 < 0xffffffff) {
          pmVar15 = pmVar11;
        }
        pmVar16 = (mz_uint64 *)0x0;
        pComp_size = (mz_uint64 *)0x0;
      }
      else {
        pmVar16 = &uncomp_size;
        if (local_f0 < 0xffffffff) {
          pmVar16 = pmVar11;
        }
        pComp_size = &comp_size;
        if (local_f0 < 0xffffffff) {
          pComp_size = pmVar11;
        }
        if (uVar24 < 0xffffffff) {
          pmVar15 = pmVar11;
        }
      }
      local_e8 = extra_data;
      mVar9 = mz_zip_writer_create_zip64_extra_data(local_e8,pmVar16,pComp_size,pmVar15);
      sVar14 = (size_t)mVar9;
    }
    sVar4 = local_100;
    iVar20 = (int)sVar14 + user_extra_data_len;
    uVar5 = 0x14;
    if (uVar6 == 0) {
      uVar5 = 0;
    }
    local_88._0_5_ = CONCAT14(uVar5,0x4034b50);
    local_88._0_6_ = (uint6)(uint5)local_88;
    local_88._0_7_ = CONCAT16((char)local_f8,(uint6)local_88);
    local_88 = CONCAT17((char)(local_f8 >> 8),(undefined7)local_88);
    local_b8 = CONCAT44(local_b8._4_4_,iVar18);
    uStack_7f = 0;
    uStack_7e = (undefined1)dos_time;
    local_bc = (uint)dos_time;
    uStack_7d = (undefined1)(dos_time >> 8);
    local_c0 = (uint)dos_date;
    uStack_7c = (undefined1)dos_date;
    uStack_7b = (undefined1)(dos_date >> 8);
    uStack_7a = 0;
    uStack_78 = 0;
    lStack_72 = (ulong)CONCAT13((char)((uint)iVar20 >> 8),CONCAT12((char)iVar20,(short)local_100))
                << 0x20;
    uStack_80 = (char)iVar18;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar24,&local_88,0x1e);
    if (sVar12 != 0x1e) {
LAB_0010e821:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar24 + 0x1e,local_b0,sVar4);
    if (sVar12 != sVar4) goto LAB_0010e821;
    mVar23 = uVar24 + 0x1e + sVar4;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,extra_data,sVar14);
    if (sVar12 != sVar14) goto LAB_0010e821;
    mVar23 = mVar23 + sVar14;
  }
  if (user_extra_data_len != 0) {
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,user_extra_data,(size_t)local_118);
    if ((mz_uint8 *)sVar12 != local_118) goto LAB_0010ec65;
    mVar23 = mVar23 + (long)local_118;
  }
  if (local_f0 == 0) {
    comp_size_00 = 0;
  }
  else {
    pmVar13 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
    if (pmVar13 == (mz_uint8 *)0x0) {
LAB_0010e8b7:
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    local_118 = pmVar13;
    local_68 = sVar14;
    if (uVar6 == 0) {
      mVar25 = 0;
      comp_size_00 = 0;
      while (sVar14 = (*local_e0)(local_d8,mVar25,pmVar13,0x10000), mVar17 = mVar25, sVar14 != 0) {
        if ((0x10000 < sVar14) || (mVar25 = mVar25 + sVar14, local_f0 < mVar25)) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar13);
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
          return 0;
        }
        sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,pmVar13,sVar14);
        if (sVar12 != sVar14) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pmVar13);
          goto LAB_0010ec65;
        }
        comp_size_00 = mz_crc32(comp_size_00 & 0xffffffff,pmVar13,sVar14);
        mVar23 = mVar23 + sVar14;
      }
    }
    else {
      local_c4 = MZ_ZIP_FILE_READ_FAILED;
      d = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
      if (d == (tdefl_compressor *)0x0) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
        goto LAB_0010e8b7;
      }
      state.m_comp_size = 0;
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = mVar23;
      mVar7 = tdefl_create_comp_flags_from_zip_params(uVar6,-0xf,0);
      tdefl_init(d,mz_zip_writer_add_put_buf_callback,&state,mVar7);
      comp_size_00 = 0;
      pmVar13 = local_118;
      mVar17 = 0;
      do {
        sVar14 = (*local_e0)(local_d8,mVar17,pmVar13,0x10000);
        pmVar13 = local_118;
        if ((0x10000 < sVar14) || (uVar22 = sVar14 + mVar17, local_f0 < uVar22)) goto LAB_0010e8ef;
        comp_size_00 = mz_crc32(comp_size_00 & 0xffffffff,local_118,sVar14);
        if (pZip->m_pNeeds_keepalive == (mz_file_needs_keepalive)0x0) {
          flush = TDEFL_NO_FLUSH;
        }
        else {
          mVar8 = (*pZip->m_pNeeds_keepalive)(pZip->m_pIO_opaque);
          flush = (uint)(mVar8 != 0) * 3;
        }
        if (sVar14 == 0) {
          flush = TDEFL_FINISH;
        }
        tVar10 = tdefl_compress_buffer(d,pmVar13,sVar14,flush);
        mVar17 = uVar22;
      } while (tVar10 == TDEFL_STATUS_OKAY);
      if (tVar10 == TDEFL_STATUS_DONE) {
        bVar3 = false;
      }
      else {
        local_c4 = MZ_ZIP_COMPRESSION_FAILED;
LAB_0010e8ef:
        pZip->m_last_error = local_c4;
        bVar3 = true;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,d);
      if (bVar3) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
        return 0;
      }
      comp_size = state.m_comp_size;
      mVar23 = state.m_cur_archive_file_ofs;
      mVar25 = comp_size;
    }
    uncomp_size = mVar17;
    comp_size = mVar25;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_118);
    sVar14 = local_68;
  }
  mVar25 = state.m_cur_archive_file_ofs;
  pmVar13 = local_e8;
  extra_size = (mz_uint16)sVar14;
  local_118 = (mz_uint8 *)(ulong)(ushort)local_c0;
  local_e0 = (mz_file_read_func)(ulong)(ushort)local_bc;
  local_d8 = (void *)(local_b8 & 0xffff);
  if (uVar21 == 0) {
    state.m_pZip = (mz_zip_archive *)
                   CONCAT17((char)(comp_size_00 >> 0x18),
                            CONCAT16((char)(comp_size_00 >> 0x10),
                                     CONCAT15((char)(comp_size_00 >> 8),
                                              CONCAT14((char)comp_size_00,0x8074b50))));
    uVar5 = (undefined1)(uncomp_size >> 0x18);
    if (local_e8 == (mz_uint8 *)0x0) {
      if (comp_size >> 0x20 != 0) {
LAB_0010e480:
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
        return 0;
      }
      pmVar15 = &state.m_cur_archive_file_ofs;
      state.m_cur_archive_file_ofs._7_1_ = SUB81(mVar25,7);
      state.m_cur_archive_file_ofs._0_7_ =
           CONCAT16((char)(uncomp_size >> 0x10),
                    CONCAT15((char)(uncomp_size >> 8),CONCAT14((char)uncomp_size,(int)comp_size)));
      sVar14 = 0x10;
    }
    else {
      pmVar15 = &state.m_comp_size;
      state.m_cur_archive_file_ofs = comp_size;
      state.m_comp_size._0_7_ = (undefined7)uncomp_size;
      uVar5 = (undefined1)(uncomp_size >> 0x38);
      sVar14 = 0x18;
    }
    *(undefined1 *)((long)pmVar15 + 7) = uVar5;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,&state,sVar14);
    if (sVar12 != sVar14) {
      return 0;
    }
    mVar23 = mVar23 + sVar14;
    if (pmVar13 == (mz_uint8 *)0x0) goto LAB_0010ebd8;
  }
  else {
    if (local_e8 != (mz_uint8 *)0x0) {
      pmVar15 = (mz_uint64 *)0x0;
      pmVar11 = &uncomp_size;
      if (local_f0 < 0xffffffff) {
        pmVar11 = pmVar15;
      }
      pmVar16 = &comp_size;
      if (local_f0 < 0xffffffff) {
        pmVar16 = pmVar15;
      }
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar15 = &local_dir_header_ofs;
      }
      mVar9 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar11,pmVar16,pmVar15);
      sVar14 = (size_t)mVar9;
    }
    extra_size = (mz_uint16)sVar14;
    mVar25 = uncomp_size;
    mVar17 = comp_size;
    if (0xfffffffe < local_f0) {
      mVar25 = 0xffffffff;
      mVar17 = 0xffffffff;
    }
    mz_zip_writer_create_local_dir_header
              ((mz_zip_archive *)&local_88,(mz_uint8 *)(ulong)((uint)local_100 & 0xffff),
               (short)user_extra_data_len + extra_size,(mz_uint16)mVar25,mVar17,comp_size_00,
               (mz_uint32)local_d8,(mz_uint16)local_f8,(mz_uint16)local_e0,(mz_uint16)local_118,
               (mz_uint16)comp_size_00);
    mVar25 = local_dir_header_ofs;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,(mz_zip_archive *)&local_88,
                               0x1e);
    sVar4 = local_100;
    if (sVar12 != 0x1e) {
LAB_0010ec65:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    if (pmVar13 == (mz_uint8 *)0x0) goto LAB_0010ebd8;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25 + 0x1e,local_b0,local_100);
    if ((sVar12 != sVar4) ||
       (sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar25 + 0x1e + local_100,extra_data,
                                   sVar14 & 0xffffffff), sVar12 != (sVar14 & 0xffffffff)))
    goto LAB_0010ec65;
  }
  pmVar15 = (mz_uint64 *)0x0;
  pmVar11 = &uncomp_size;
  if (uncomp_size < 0xffffffff) {
    pmVar11 = pmVar15;
  }
  pmVar16 = &comp_size;
  if (uncomp_size < 0xffffffff) {
    pmVar16 = pmVar15;
  }
  if (0xfffffffe < local_dir_header_ofs) {
    pmVar15 = &local_dir_header_ofs;
  }
  mVar9 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar11,pmVar16,pmVar15);
  extra_size = (mz_uint16)mVar9;
LAB_0010ebd8:
  mVar8 = mz_zip_writer_add_to_central_dir
                    (pZip,local_b0,(mz_uint16)local_100,pmVar13,extra_size,pComment,
                     (mz_uint16)local_60,uncomp_size,comp_size,(mz_uint32)comp_size_00,
                     (mz_uint16)local_d8,(mz_uint16)local_f8,(mz_uint16)local_e0,
                     (mz_uint16)local_118,local_dir_header_ofs,ext_attributes,
                     user_extra_data_central,user_extra_data_central_len);
  if (mVar8 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = mVar23;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_read_buf_callback(
    mz_zip_archive *pZip, const char *pArchive_name,
    mz_file_read_func read_callback, void *callback_opaque, mz_uint64 max_size,
    const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags, mz_uint32 ext_attributes,
    const char *user_extra_data, mz_uint user_extra_data_len,
    const char *user_extra_data_central, mz_uint user_extra_data_central_len) {
  mz_uint16 gen_flags;
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size,
                                  uncomp_size = 0, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  mz_uint8 *pExtra_data = NULL;
  mz_uint32 extra_size = 0;
  mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
  mz_zip_internal_state *pState;
  mz_uint64 file_ofs = 0, cur_archive_header_file_ofs;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  gen_flags = (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)
                  ? 0
                  : MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

  if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
    gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

  /* Sanity checks */
  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  pState = pZip->m_pState;

  if ((!pState->m_zip64) && (max_size > MZ_UINT32_MAX)) {
    /* Source file is too large for non-zip64 */
    /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    pState->m_zip64 = MZ_TRUE;
  }

  /* We could support this, but why? */
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  if (pState->m_zip64) {
    if (pZip->m_total_files == MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
  } else {
    if (pZip->m_total_files == MZ_UINT16_MAX) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
    }
  }

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
  if (((mz_uint64)pState->m_central_dir.m_size +
       MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size +
       MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

  if (!pState->m_zip64) {
    /* Bail early if the archive would obviously become too large */
    if ((pZip->m_archive_size + num_alignment_padding_bytes +
         MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size +
         MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size +
         user_extra_data_len + pState->m_central_dir.m_size +
         MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024 +
         MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) >
        0xFFFFFFFF) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    }
  }

#ifndef MINIZ_NO_TIME
  if (pFile_time) {
    mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
  }
#else
  (void)pFile_time;
#endif

  if (max_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes)) {
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
  }

  cur_archive_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_archive_file_ofs;

  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (max_size && level) {
    method = MZ_DEFLATED;
  }

  MZ_CLEAR_ARR(local_dir_header);
  if (pState->m_zip64) {
    if (max_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX) {
      pExtra_data = extra_data;
      if (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)
        extra_size = mz_zip_writer_create_zip64_extra_data(
            extra_data, (max_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
            (max_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
            (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                    : NULL);
      else
        extra_size = mz_zip_writer_create_zip64_extra_data(
            extra_data, NULL, NULL,
            (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                    : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method,
            gen_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += archive_name_size;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data,
                       extra_size) != extra_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += extra_size;
  } else {
    if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
      return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)user_extra_data_len, 0, 0, 0, method, gen_flags,
            dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += archive_name_size;
  }

  if (user_extra_data_len > 0) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       user_extra_data,
                       user_extra_data_len) != user_extra_data_len)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += user_extra_data_len;
  }

  if (max_size) {
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!level) {
      while (1) {
        size_t n = read_callback(callback_opaque, file_ofs, pRead_buf,
                                 MZ_ZIP_MAX_IO_BUF_SIZE);
        if (n == 0)
          break;

        if ((n > MZ_ZIP_MAX_IO_BUF_SIZE) || (file_ofs + n > max_size)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                           n) != n) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        file_ofs += n;
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        cur_archive_file_ofs += n;
      }
      uncomp_size = file_ofs;
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
      }

      for (;;) {
        tdefl_status status;
        tdefl_flush flush = TDEFL_NO_FLUSH;

        size_t n = read_callback(callback_opaque, file_ofs, pRead_buf,
                                 MZ_ZIP_MAX_IO_BUF_SIZE);
        if ((n > MZ_ZIP_MAX_IO_BUF_SIZE) || (file_ofs + n > max_size)) {
          mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
          break;
        }

        file_ofs += n;
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);

        if (pZip->m_pNeeds_keepalive != NULL &&
            pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
          flush = TDEFL_FULL_FLUSH;

        if (n == 0)
          flush = TDEFL_FINISH;

        status = tdefl_compress_buffer(pComp, pRead_buf, n, flush);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY) {
          mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
          break;
        }
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return MZ_FALSE;
      }

      uncomp_size = file_ofs;
      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  if (!(level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)) {
    mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
    mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

    MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
    MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
    if (pExtra_data == NULL) {
      if (comp_size > MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

      MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
    } else {
      MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
      local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
    }

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_footer,
                       local_dir_footer_size) != local_dir_footer_size)
      return MZ_FALSE;

    cur_archive_file_ofs += local_dir_footer_size;
  }

  if (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE) {
    if (pExtra_data != NULL) {
      extra_size = mz_zip_writer_create_zip64_extra_data(
          extra_data, (max_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
          (max_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
          (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                  : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len),
            (max_size >= MZ_UINT32_MAX) ? MZ_UINT32_MAX : uncomp_size,
            (max_size >= MZ_UINT32_MAX) ? MZ_UINT32_MAX : comp_size,
            uncomp_crc32, method, gen_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    cur_archive_header_file_ofs = local_dir_header_ofs;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    if (pExtra_data != NULL) {
      cur_archive_header_file_ofs += sizeof(local_dir_header);

      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                         pArchive_name,
                         archive_name_size) != archive_name_size) {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
      }

      cur_archive_header_file_ofs += archive_name_size;

      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                         extra_data, extra_size) != extra_size)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

      cur_archive_header_file_ofs += extra_size;
    }
  }

  if (pExtra_data != NULL) {
    extra_size = mz_zip_writer_create_zip64_extra_data(
        extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
        (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
        (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
  }

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data,
          (mz_uint16)extra_size, pComment, comment_size, uncomp_size, comp_size,
          uncomp_crc32, method, gen_flags, dos_time, dos_date,
          local_dir_header_ofs, ext_attributes, user_extra_data_central,
          user_extra_data_central_len))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}